

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

void __thiscall
sc_core::sc_trace_file_base::sc_trace_file_base(sc_trace_file_base *this,char *name,char *extension)

{
  sc_object *this_00;
  char *nm;
  ostream *poVar1;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  sc_trace_file::sc_trace_file(&this->super_sc_trace_file);
  this_00 = &this->super_sc_object;
  nm = sc_gen_unique_name("$$$$kernel_tracefile$$$$",false);
  sc_object::sc_object(this_00,nm);
  (this->super_sc_trace_file)._vptr_sc_trace_file = (_func_int **)&PTR___cxa_pure_virtual_00264588;
  (this->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_002646c0;
  this->fp = (FILE *)0x0;
  this->trace_unit_fs = 0;
  *(undefined8 *)((long)&this->trace_unit_fs + 1) = 0;
  *(undefined8 *)((long)&this->kernel_unit_fs + 1) = 0;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  this->initialized_ = false;
  this->trace_delta_cycles_ = false;
  if ((name == (char *)0x0) || (*name == '\0')) {
    sc_report_handler::report
              (SC_ERROR,"cannot open trace file for writing","no name given",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0x4e);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_1a0,name);
    poVar1 = std::operator<<(poVar1,".");
    std::operator<<(poVar1,extension);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::swap(local_1d0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    sc_object::detach(this_00);
    sc_object::register_simulation_phase_callback(this_00,0x800);
  }
  return;
}

Assistant:

sc_trace_file_base::sc_trace_file_base( const char* name, const char* extension )
  : sc_trace_file()
#if SC_TRACING_PHASE_CALLBACKS_
  , sc_object( sc_gen_unique_name("$$$$kernel_tracefile$$$$") )
#endif
  , fp(0)
  , trace_unit_fs()
  , kernel_unit_fs()
  , timescale_set_by_user(false)
  , filename_()
  , initialized_(false)
  , trace_delta_cycles_(false)
{
    if( !name || !*name ) {
        SC_REPORT_ERROR( SC_ID_TRACING_FOPEN_FAILED_, "no name given" );
        return;
    } else {
        std::stringstream ss;
        ss << name << "." << extension;
        ss.str().swap( filename_ );
    }

#if SC_TRACING_PHASE_CALLBACKS_ == 1
    // remove from hierarchy
    sc_object::detach();
    // register regular (non-delta) callbacks
    sc_object::register_simulation_phase_callback( SC_BEFORE_TIMESTEP );
#else // explicitly register with simcontext
    sc_get_curr_simcontext()->add_trace_file( this );
#endif
}